

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O3

void ngx_rbtree_insert(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  u_char uVar1;
  ngx_rbtree_node_t *pnVar2;
  ngx_rbtree_node_t *pnVar3;
  ngx_rbtree_node_t *pnVar4;
  ngx_rbtree_node_t *pnVar5;
  ngx_rbtree_t *pnVar6;
  ngx_rbtree_node_t *pnVar7;
  
  pnVar2 = tree->sentinel;
  if (tree->root == pnVar2) {
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->left = pnVar2;
    node->right = pnVar2;
    node->color = '\0';
    tree->root = node;
  }
  else {
    (*tree->insert)(tree->root,node,pnVar2);
    pnVar4 = tree->root;
    if (pnVar4 != node) {
      pnVar5 = node->parent;
      uVar1 = pnVar5->color;
      while (uVar1 != '\0') {
        pnVar4 = pnVar5->parent;
        pnVar7 = pnVar4->left;
        if (pnVar5 == pnVar7) {
          pnVar3 = pnVar4->right;
          if (pnVar3->color == '\0') {
            pnVar3 = pnVar5->right;
            if (node == pnVar3) {
              pnVar7 = pnVar3->left;
              pnVar5->right = pnVar7;
              if (pnVar7 != pnVar2) {
                pnVar7->parent = pnVar5;
                pnVar4 = pnVar5->parent;
              }
              pnVar3->parent = pnVar4;
              pnVar6 = tree;
              if (tree->root != pnVar5) {
                pnVar6 = (ngx_rbtree_t *)&pnVar4->right;
                if (pnVar4->left == pnVar5) {
                  pnVar6 = (ngx_rbtree_t *)&pnVar4->left;
                }
              }
              pnVar6->root = pnVar3;
              pnVar3->left = pnVar5;
              pnVar5->parent = pnVar3;
              pnVar4 = pnVar3->parent;
              pnVar7 = pnVar4->left;
              node = pnVar5;
              pnVar5 = pnVar3;
            }
            pnVar5->color = '\0';
            pnVar4->color = '\x01';
            pnVar5 = pnVar7->right;
            pnVar4->left = pnVar5;
            if (pnVar5 != pnVar2) {
              pnVar5->parent = pnVar4;
            }
            pnVar5 = pnVar4->parent;
            pnVar7->parent = pnVar5;
            pnVar6 = tree;
            if (tree->root != pnVar4) {
              pnVar6 = (ngx_rbtree_t *)&pnVar5->left;
              if (pnVar5->right == pnVar4) {
                pnVar6 = (ngx_rbtree_t *)&pnVar5->right;
              }
            }
            pnVar6->root = pnVar7;
            pnVar7->right = pnVar4;
            goto LAB_0011d6f2;
          }
          pnVar5->color = '\0';
          pnVar3->color = '\0';
LAB_0011d5b0:
          pnVar4->color = '\x01';
          node = pnVar4;
        }
        else {
          if (pnVar7->color != '\0') {
            pnVar5->color = '\0';
            pnVar7->color = '\0';
            goto LAB_0011d5b0;
          }
          pnVar7 = pnVar5->left;
          if (node == pnVar7) {
            pnVar3 = pnVar7->right;
            pnVar5->left = pnVar3;
            if (pnVar3 != pnVar2) {
              pnVar3->parent = pnVar5;
              pnVar4 = pnVar5->parent;
            }
            pnVar7->parent = pnVar4;
            pnVar6 = tree;
            if (tree->root != pnVar5) {
              pnVar6 = (ngx_rbtree_t *)&pnVar4->left;
              if (pnVar4->right == pnVar5) {
                pnVar6 = (ngx_rbtree_t *)&pnVar4->right;
              }
            }
            pnVar6->root = pnVar7;
            pnVar7->right = pnVar5;
            pnVar5->parent = pnVar7;
            pnVar4 = pnVar7->parent;
            node = pnVar5;
            pnVar5 = pnVar7;
          }
          pnVar5->color = '\0';
          pnVar4->color = '\x01';
          pnVar7 = pnVar4->right;
          pnVar5 = pnVar7->left;
          pnVar4->right = pnVar5;
          if (pnVar5 != pnVar2) {
            pnVar5->parent = pnVar4;
          }
          pnVar5 = pnVar4->parent;
          pnVar7->parent = pnVar5;
          pnVar6 = tree;
          if (tree->root != pnVar4) {
            pnVar6 = (ngx_rbtree_t *)&pnVar5->right;
            if (pnVar5->left == pnVar4) {
              pnVar6 = (ngx_rbtree_t *)&pnVar5->left;
            }
          }
          pnVar6->root = pnVar7;
          pnVar7->left = pnVar4;
LAB_0011d6f2:
          pnVar4->parent = pnVar7;
        }
        pnVar4 = tree->root;
        if (node == pnVar4) break;
        pnVar5 = node->parent;
        uVar1 = pnVar5->color;
      }
    }
    pnVar4->color = '\0';
  }
  return;
}

Assistant:

void
ngx_rbtree_insert(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  **root, *temp, *sentinel;

    /* a binary tree insert */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (*root == sentinel) {
        node->parent = NULL;
        node->left = sentinel;
        node->right = sentinel;
        ngx_rbt_black(node);
        *root = node;

        return;
    }

    tree->insert(*root, node, sentinel);

    /* re-balance tree */

    while (node != *root && ngx_rbt_is_red(node->parent)) {

        if (node->parent == node->parent->parent->left) {
            temp = node->parent->parent->right;

            if (ngx_rbt_is_red(temp)) {
                ngx_rbt_black(node->parent);
                ngx_rbt_black(temp);
                ngx_rbt_red(node->parent->parent);
                node = node->parent->parent;

            } else {
                if (node == node->parent->right) {
                    node = node->parent;
                    ngx_rbtree_left_rotate(root, sentinel, node);
                }

                ngx_rbt_black(node->parent);
                ngx_rbt_red(node->parent->parent);
                ngx_rbtree_right_rotate(root, sentinel, node->parent->parent);
            }

        } else {
            temp = node->parent->parent->left;

            if (ngx_rbt_is_red(temp)) {
                ngx_rbt_black(node->parent);
                ngx_rbt_black(temp);
                ngx_rbt_red(node->parent->parent);
                node = node->parent->parent;

            } else {
                if (node == node->parent->left) {
                    node = node->parent;
                    ngx_rbtree_right_rotate(root, sentinel, node);
                }

                ngx_rbt_black(node->parent);
                ngx_rbt_red(node->parent->parent);
                ngx_rbtree_left_rotate(root, sentinel, node->parent->parent);
            }
        }
    }

    ngx_rbt_black(*root);
}